

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressLiterals
                 (ZSTD_hufCTables_t *prevHuf,ZSTD_hufCTables_t *nextHuf,ZSTD_strategy strategy,
                 int disableLiteralCompression,void *dst,size_t dstCapacity,void *src,size_t srcSize
                 ,void *workspace,size_t wkspSize,int bmi2)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong local_a0;
  uint local_98;
  U32 lhc_2;
  U32 lhc_1;
  U32 lhc;
  int preferRepeat;
  HUF_repeat repeat;
  size_t minLitSize;
  size_t cLitSize;
  symbolEncodingType_e hType;
  U32 singleStream;
  BYTE *ostart;
  size_t lhSize;
  size_t minGain;
  size_t dstCapacity_local;
  void *dst_local;
  int disableLiteralCompression_local;
  ZSTD_strategy strategy_local;
  ZSTD_hufCTables_t *nextHuf_local;
  ZSTD_hufCTables_t *prevHuf_local;
  
  minGain = dstCapacity;
  dstCapacity_local = (size_t)dst;
  dst_local._0_4_ = disableLiteralCompression;
  dst_local._4_4_ = strategy;
  _disableLiteralCompression_local = nextHuf;
  nextHuf_local = prevHuf;
  lhSize = ZSTD_minGain(srcSize,strategy);
  ostart = (BYTE *)(long)(int)((0x3ff < srcSize) + 3 + (uint)(0x3fff < srcSize));
  _hType = (void *)dstCapacity_local;
  cLitSize._4_4_ = (uint)(srcSize < 0x100);
  cLitSize._0_4_ = 2;
  memcpy(_disableLiteralCompression_local,nextHuf_local,0x404);
  if ((int)dst_local == 0) {
    iVar1 = 0x3f;
    if (nextHuf_local->repeatMode == HUF_repeat_valid) {
      iVar1 = 6;
    }
    _preferRepeat = (ulong)iVar1;
    if (_preferRepeat < srcSize) {
      if (minGain < ostart + 1) {
        prevHuf_local = (ZSTD_hufCTables_t *)0xffffffffffffffba;
      }
      else {
        lhc = nextHuf_local->repeatMode;
        if (dst_local._4_4_ < ZSTD_lazy) {
          local_98 = (uint)(srcSize < 0x401);
        }
        else {
          local_98 = 0;
        }
        if ((lhc == HUF_repeat_valid) && (ostart == (BYTE *)0x3)) {
          cLitSize._4_4_ = 1;
        }
        if (cLitSize._4_4_ == 0) {
          local_a0 = HUF_compress4X_repeat
                               ((BYTE *)((long)_hType + (long)ostart),minGain - (long)ostart,src,
                                srcSize,0xff,0xb,workspace,wkspSize,
                                (HUF_CElt *)_disableLiteralCompression_local,&lhc,local_98,bmi2);
        }
        else {
          local_a0 = HUF_compress1X_repeat
                               ((BYTE *)((long)_hType + (long)ostart),minGain - (long)ostart,src,
                                srcSize,0xff,0xb,workspace,wkspSize,
                                (HUF_CElt *)_disableLiteralCompression_local,&lhc,local_98,bmi2);
        }
        minLitSize = local_a0;
        if (lhc != 0) {
          cLitSize._0_4_ = 3;
        }
        uVar4 = srcSize - lhSize;
        uVar2 = ERR_isError(local_a0);
        if ((local_a0 == 0 || uVar4 <= local_a0) || uVar2 != 0) {
          memcpy(_disableLiteralCompression_local,nextHuf_local,0x404);
          prevHuf_local =
               (ZSTD_hufCTables_t *)
               ZSTD_noCompressLiterals((void *)dstCapacity_local,minGain,src,srcSize);
        }
        else if (minLitSize == 1) {
          memcpy(_disableLiteralCompression_local,nextHuf_local,0x404);
          prevHuf_local =
               (ZSTD_hufCTables_t *)
               ZSTD_compressRleLiteralsBlock((void *)dstCapacity_local,minGain,src,srcSize);
        }
        else {
          if ((int)cLitSize == 2) {
            _disableLiteralCompression_local->repeatMode = HUF_repeat_check;
          }
          iVar1 = (int)srcSize;
          iVar3 = (int)minLitSize;
          if (ostart == (BYTE *)0x3) {
            MEM_writeLE24(_hType,(int)cLitSize + (uint)((cLitSize._4_4_ != 0 ^ 0xffU) & 1) * 4 +
                                 iVar1 * 0x10 + iVar3 * 0x4000);
          }
          else if (ostart == (BYTE *)0x4) {
            MEM_writeLE32(_hType,(int)cLitSize + 8 + iVar1 * 0x10 + iVar3 * 0x40000);
          }
          else if (ostart == (BYTE *)0x5) {
            MEM_writeLE32(_hType,(int)cLitSize + 0xc + iVar1 * 0x10 + iVar3 * 0x400000);
            *(char *)((long)_hType + 4) = (char)(minLitSize >> 10);
          }
          prevHuf_local = (ZSTD_hufCTables_t *)(ostart + minLitSize);
        }
      }
    }
    else {
      prevHuf_local =
           (ZSTD_hufCTables_t *)
           ZSTD_noCompressLiterals((void *)dstCapacity_local,minGain,src,srcSize);
    }
  }
  else {
    prevHuf_local =
         (ZSTD_hufCTables_t *)ZSTD_noCompressLiterals((void *)dstCapacity_local,minGain,src,srcSize)
    ;
  }
  return (size_t)prevHuf_local;
}

Assistant:

static size_t ZSTD_compressLiterals (ZSTD_hufCTables_t const* prevHuf,
                                     ZSTD_hufCTables_t* nextHuf,
                                     ZSTD_strategy strategy, int disableLiteralCompression,
                                     void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                                     void* workspace, size_t wkspSize,
                               const int bmi2)
{
    size_t const minGain = ZSTD_minGain(srcSize, strategy);
    size_t const lhSize = 3 + (srcSize >= 1 KB) + (srcSize >= 16 KB);
    BYTE*  const ostart = (BYTE*)dst;
    U32 singleStream = srcSize < 256;
    symbolEncodingType_e hType = set_compressed;
    size_t cLitSize;

    DEBUGLOG(5,"ZSTD_compressLiterals (disableLiteralCompression=%i)",
                disableLiteralCompression);

    /* Prepare nextEntropy assuming reusing the existing table */
    memcpy(nextHuf, prevHuf, sizeof(*prevHuf));

    if (disableLiteralCompression)
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);

    /* small ? don't even attempt compression (speed opt) */
#   define COMPRESS_LITERALS_SIZE_MIN 63
    {   size_t const minLitSize = (prevHuf->repeatMode == HUF_repeat_valid) ? 6 : COMPRESS_LITERALS_SIZE_MIN;
        if (srcSize <= minLitSize) return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }

    if (dstCapacity < lhSize+1) return ERROR(dstSize_tooSmall);   /* not enough space for compression */
    {   HUF_repeat repeat = prevHuf->repeatMode;
        int const preferRepeat = strategy < ZSTD_lazy ? srcSize <= 1024 : 0;
        if (repeat == HUF_repeat_valid && lhSize == 3) singleStream = 1;
        cLitSize = singleStream ? HUF_compress1X_repeat(ostart+lhSize, dstCapacity-lhSize, src, srcSize, 255, 11,
                                      workspace, wkspSize, (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2)
                                : HUF_compress4X_repeat(ostart+lhSize, dstCapacity-lhSize, src, srcSize, 255, 11,
                                      workspace, wkspSize, (HUF_CElt*)nextHuf->CTable, &repeat, preferRepeat, bmi2);
        if (repeat != HUF_repeat_none) {
            /* reused the existing table */
            hType = set_repeat;
        }
    }

    if ((cLitSize==0) | (cLitSize >= srcSize - minGain) | ERR_isError(cLitSize)) {
        memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_noCompressLiterals(dst, dstCapacity, src, srcSize);
    }
    if (cLitSize==1) {
        memcpy(nextHuf, prevHuf, sizeof(*prevHuf));
        return ZSTD_compressRleLiteralsBlock(dst, dstCapacity, src, srcSize);
    }

    if (hType == set_compressed) {
        /* using a newly constructed table */
        nextHuf->repeatMode = HUF_repeat_check;
    }

    /* Build header */
    switch(lhSize)
    {
    case 3: /* 2 - 2 - 10 - 10 */
        {   U32 const lhc = hType + ((!singleStream) << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<14);
            MEM_writeLE24(ostart, lhc);
            break;
        }
    case 4: /* 2 - 2 - 14 - 14 */
        {   U32 const lhc = hType + (2 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<18);
            MEM_writeLE32(ostart, lhc);
            break;
        }
    case 5: /* 2 - 2 - 18 - 18 */
        {   U32 const lhc = hType + (3 << 2) + ((U32)srcSize<<4) + ((U32)cLitSize<<22);
            MEM_writeLE32(ostart, lhc);
            ostart[4] = (BYTE)(cLitSize >> 10);
            break;
        }
    default:  /* not possible : lhSize is {3,4,5} */
        assert(0);
    }
    return lhSize+cLitSize;
}